

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::addRow(Highs *this,double lower_bound,double upper_bound,HighsInt num_new_nz,
             HighsInt *indices,double *values)

{
  HighsStatus HVar1;
  HighsInt starts;
  HighsInt *in_stack_00000070;
  HighsInt in_stack_0000007c;
  double *in_stack_00000080;
  double *in_stack_00000088;
  HighsInt in_stack_00000094;
  Highs *in_stack_00000098;
  HighsInt *in_stack_000000b0;
  double *in_stack_000000b8;
  Highs *in_stack_ffffffffffffffb0;
  
  logHeader(in_stack_ffffffffffffffb0);
  HVar1 = addRows(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000080,
                  in_stack_0000007c,in_stack_00000070,in_stack_000000b0,in_stack_000000b8);
  return HVar1;
}

Assistant:

HighsStatus Highs::addRow(const double lower_bound, const double upper_bound,
                          const HighsInt num_new_nz, const HighsInt* indices,
                          const double* values) {
  this->logHeader();
  HighsInt starts = 0;
  return addRows(1, &lower_bound, &upper_bound, num_new_nz, &starts, indices,
                 values);
}